

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O1

void __thiscall
AddIRCCommand::trigger
          (AddIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Server *server;
  PlayerInfo *player;
  char *pcVar6;
  undefined8 uVar7;
  ModGroup *pMVar8;
  size_t sVar9;
  char *pcVar10;
  char *in_whitespace_end;
  bool bVar11;
  bool bVar12;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  string local_90;
  size_t local_70;
  char *local_68;
  ModGroup *local_60;
  size_t local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  in_whitespace_end = nick._M_str;
  sVar9 = nick._M_len;
  pcVar6 = channel._M_str;
  local_70 = parameters._M_len;
  pcVar10 = in_whitespace_end;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             in_whitespace_end);
  if (local_50.second._M_len == 0) {
    pcVar10 = "Error: Too few parameters. Syntax: add <level> <player>";
    uVar7 = 0x37;
    goto LAB_0010fbdf;
  }
  local_58 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,pcVar6);
  if (lVar3 == 0) {
    return;
  }
  Jupiter::IRC::Client::Channel::getType();
  if ((int)*parameters._M_str - 0x30U < 10) {
    jessilib::
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_90,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len,
               " \t","",pcVar10);
    uVar2 = Jupiter_strtoi_s(local_90._M_string_length,local_90._M_dataplus._M_p,0);
    if (((int)uVar2 < 0) ||
       ((int)pluginInstance.groups.
             super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
             ._M_impl._M_node._M_size <= (int)uVar2)) {
      Jupiter::IRC::Client::sendNotice
                (source,sVar9,in_whitespace_end,0x1b,"Error: Invalid group index.");
      goto LAB_0010f99e;
    }
    if (pluginInstance.groups.
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node._M_size == 0) {
LAB_0010fbfa:
      pMVar8 = (ModGroup *)0x0;
    }
    else {
      bVar11 = pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node.super__List_node_base._M_next ==
               (_List_node_base *)&pluginInstance.groups;
      pMVar8 = (ModGroup *)
               pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (!bVar11) {
        if (uVar2 != 0) {
          uVar4 = (ulong)uVar2;
          do {
            pMVar8 = *(ModGroup **)pMVar8;
            bVar11 = pMVar8 == (ModGroup *)&pluginInstance.groups;
            if (bVar11) goto LAB_0010fbf6;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        pMVar8 = (ModGroup *)&pMVar8->prefix;
      }
LAB_0010fbf6:
      if (bVar11) goto LAB_0010fbfa;
    }
    local_70 = local_90.field_2._M_allocated_capacity;
    parameters._M_str = (char *)local_90.field_2._8_8_;
  }
  else {
LAB_0010f99e:
    pMVar8 = (ModGroup *)0x0;
  }
  if (pMVar8 != (ModGroup *)0x0) {
    RenX::getCore();
    lVar3 = RenX::Core::getServerCount();
    if (lVar3 != 0) {
      bVar11 = false;
      uVar4 = 1;
      local_68 = pcVar6;
      local_60 = pMVar8;
      do {
        uVar5 = RenX::getCore();
        server = (Server *)RenX::Core::getServer(uVar5);
        cVar1 = RenX::Server::isLogChanType((int)server);
        if (cVar1 != '\0') {
          player = (PlayerInfo *)
                   RenX::Server::getPlayerByPartName(server,local_70,parameters._M_str);
          if (player == (PlayerInfo *)0x0) {
            uVar7 = 0x18;
            pcVar10 = "Error: Player not found.";
LAB_0010faf9:
            Jupiter::IRC::Client::sendNotice(source,sVar9,in_whitespace_end,uVar7,pcVar10);
          }
          else {
            if (player->isBot == true) {
              uVar7 = 0x24;
              pcVar10 = "Error: A bot can not be a moderator.";
              goto LAB_0010faf9;
            }
            if ((player->uuid)._M_string_length == 0) {
              uVar7 = 0x1a;
              pcVar10 = "Error: Player has no UUID.";
              goto LAB_0010faf9;
            }
            RenX_ModSystemPlugin::resetAccess(&pluginInstance,player);
            pMVar8 = local_60;
            bVar11 = RenX_ModSystemPlugin::set(&pluginInstance,player,local_60);
            if (bVar11) {
              string_printf_abi_cxx11_
                        (&local_90,"%.*s has been added to group \"%.*s\"",
                         (player->name)._M_string_length,(player->name)._M_dataplus._M_p,
                         (pMVar8->name)._M_string_length,(pMVar8->name)._M_dataplus._M_p);
              Jupiter::IRC::Client::sendNotice
                        (source,sVar9,in_whitespace_end,local_90._M_string_length,
                         local_90._M_dataplus._M_p);
            }
            else {
              string_printf_abi_cxx11_
                        (&local_90,"%.*s has been moved to group \"%.*s\"",
                         (player->name)._M_string_length,(player->name)._M_dataplus._M_p,
                         (pMVar8->name)._M_string_length,(pMVar8->name)._M_dataplus._M_p);
              Jupiter::IRC::Client::sendNotice
                        (source,sVar9,in_whitespace_end,local_90._M_string_length,
                         local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            RenX_ModSystemPlugin::auth(&pluginInstance,server,player,false,true);
          }
          bVar11 = true;
        }
        RenX::getCore();
        uVar5 = RenX::Core::getServerCount();
        bVar12 = uVar5 != uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar12);
      pcVar6 = local_68;
      if (bVar11) {
        return;
      }
    }
    Jupiter::IRC::Client::sendMessage
              (source,local_58,pcVar6,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
    return;
  }
  pcVar10 = "Error: Invalid group.";
  uVar7 = 0x15;
LAB_0010fbdf:
  Jupiter::IRC::Client::sendNotice(source,sVar9,in_whitespace_end,uVar7,pcVar10);
  return;
}

Assistant:

void AddIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too few parameters. Syntax: add <level> <player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		RenX::Server *server;
		RenX::PlayerInfo *player;
		RenX_ModSystemPlugin::ModGroup *group = nullptr;
		int type = chan->getType();
		bool serverMatch = false;
		std::string_view playerName = parameters;
		if (isdigit(parameters[0])) {
			auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			int index = Jupiter::asInt(parameters_split.first);

			if (index < 0 || index >= static_cast<int>(pluginInstance.groups.size())) {
				source->sendNotice(nick, "Error: Invalid group index."sv);
			}
			else {
				group = pluginInstance.getGroupByIndex(index);
				playerName = parameters_split.second;
			}
		}
		if (group == nullptr)
			source->sendNotice(nick, "Error: Invalid group."sv);
		else {
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					serverMatch = true;
					player = server->getPlayerByPartName(playerName);
					if (player == nullptr)
						source->sendNotice(nick, "Error: Player not found."sv);
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (player->uuid.empty())
						source->sendNotice(nick, "Error: Player has no UUID."sv);
					else {
						pluginInstance.resetAccess(*player);
						if (pluginInstance.set(*player, *group))
							source->sendNotice(nick, string_printf("%.*s has been added to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						else
							source->sendNotice(nick, string_printf("%.*s has been moved to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						pluginInstance.auth(*server, *player, false, true);
					}
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}